

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,REF_INT global0,REF_INT global1)

{
  int cell;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  uint uVar4;
  REF_INT RVar5;
  REF_GRID pRVar6;
  REF_CELL *ppRVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  REF_INT edge;
  REF_INT node1;
  REF_INT node0;
  REF_INT part;
  REF_INT local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  ref_node = ref_subdiv->grid->node;
  uVar3 = ref_node_local(ref_node,(long)global0,&local_38);
  uVar13 = (ulong)uVar3;
  if ((uVar3 == 0) || (uVar3 == 5)) {
    uVar4 = ref_node_local(ref_node,(long)global1,&local_3c);
    if ((uVar4 != 0) && (uVar4 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x61
             ,"ref_subdiv_inspect_global",(ulong)uVar4,"g2l1");
      uVar3 = uVar4;
    }
    if ((uVar4 != 5) && (uVar4 != 0)) {
      return uVar3;
    }
    if (local_3c == -1 || local_38 == -1) {
      return 0;
    }
    uVar3 = ref_edge_with(ref_subdiv->edge,local_38,local_3c,&local_40);
    if (uVar3 == 0) {
      uVar3 = ref_edge_part(ref_subdiv->edge,local_40,(REF_INT *)&local_34);
      if (uVar3 == 0) {
        printf(" mark %d edge %d rank %d part %d global %d %d\n",
               (ulong)(uint)ref_subdiv->mark[local_40],(long)local_40,
               (ulong)(uint)ref_subdiv->grid->mpi->id,(ulong)local_34,global0,global1);
        pRVar6 = ref_subdiv->grid;
        ppRVar7 = pRVar6->cell + 8;
        lVar11 = 8;
        do {
          if (-1 < (long)local_38) {
            ref_cell = *ppRVar7;
            pRVar1 = ref_cell->ref_adj;
            if ((local_38 < pRVar1->nnode) && (lVar12 = (long)pRVar1->first[local_38], lVar12 != -1)
               ) {
              pRVar2 = pRVar1->item + lVar12;
              RVar5 = ref_cell->node_per;
              while( true ) {
                if (0 < RVar5) {
                  cell = pRVar2->ref;
                  lVar9 = 0;
                  do {
                    if (local_3c == ref_cell->c2n[(long)ref_cell->size_per * (long)cell + lVar9]) {
                      ref_subdiv_inspect_cell(ref_subdiv,ref_cell,cell);
                      RVar5 = ref_cell->node_per;
                    }
                    lVar9 = lVar9 + 1;
                  } while ((int)lVar9 < RVar5);
                }
                pRVar2 = ref_cell->ref_adj->item;
                lVar12 = (long)pRVar2[(int)lVar12].next;
                if (lVar12 == -1) break;
                pRVar2 = pRVar2 + lVar12;
              }
              pRVar6 = ref_subdiv->grid;
            }
          }
          ppRVar7 = pRVar6->cell + lVar11 + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
        return 0;
      }
      uVar13 = (ulong)uVar3;
      pcVar10 = "part";
      uVar8 = 100;
    }
    else {
      uVar13 = (ulong)uVar3;
      pcVar10 = "with";
      uVar8 = 99;
    }
  }
  else {
    pcVar10 = "g2l0";
    uVar8 = 0x60;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar8,
         "ref_subdiv_inspect_global",uVar13,pcVar10);
  return (REF_STATUS)uVar13;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_inspect_global(REF_SUBDIV ref_subdiv,
                                             REF_INT global0, REF_INT global1) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_INT node0, node1;
  REF_INT edge, part;
  REF_INT group, item, node, cell;

  RXS(ref_node_local(ref_node, global0, &node0), REF_NOT_FOUND, "g2l0");
  RXS(ref_node_local(ref_node, global1, &node1), REF_NOT_FOUND, "g2l1");
  if (REF_EMPTY == node0 || REF_EMPTY == node1) return REF_SUCCESS;
  RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge), "with");
  RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "part");

  printf(" mark %d edge %d rank %d part %d global %d %d\n",
         ref_subdiv_mark(ref_subdiv, edge), edge,
         ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)), part, global0, global1);

  each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, node, cell) {
      RSS(ref_subdiv_inspect_cell(ref_subdiv, ref_cell, cell), "insp");
    }
  }

  return REF_SUCCESS;
}